

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goesrecv.cc
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 uVar1;
  ostream *poVar2;
  sigaction sa;
  Monitor monitor;
  Decoder decode;
  Demodulator demod;
  Type downlinkType;
  Config config;
  Options opts;
  Demodulator *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  undefined1 verbose;
  Config *this;
  Config *in_stack_fffffffffffffbf8;
  sigaction *__oact;
  milliseconds in_stack_fffffffffffffc00;
  undefined6 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc16;
  code *local_3e0;
  shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  *in_stack_fffffffffffffc38;
  Decoder *in_stack_fffffffffffffc40;
  char **in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffcec;
  Config *in_stack_fffffffffffffd08;
  _Head_base<0UL,_SamplePublisher_*,_false> in_stack_fffffffffffffd10;
  Config *in_stack_fffffffffffffd18;
  _Head_base<0UL,_SamplePublisher_*,_false> in_stack_fffffffffffffd20;
  unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> in_stack_fffffffffffffd28;
  Type in_stack_fffffffffffffd5c;
  Demodulator *in_stack_fffffffffffffd60;
  string local_1a8 [420];
  int local_4;
  
  local_4 = 0;
  parseOptions(in_stack_fffffffffffffcec,in_stack_fffffffffffffce0);
  Config::load((string *)
               in_stack_fffffffffffffd28._M_t.
               super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
               super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
               super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl);
  uVar1 = std::operator==(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
  if ((!(bool)uVar1) &&
     (in_stack_fffffffffffffc16 =
           std::operator==(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8),
     !(bool)in_stack_fffffffffffffc16)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Invalid downlink type: ");
    poVar2 = std::operator<<(poVar2,local_1a8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  verbose = (undefined1)((ulong)in_stack_fffffffffffffbf0 >> 0x38);
  Demodulator::Demodulator(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  Demodulator::initialize
            ((Demodulator *)in_stack_fffffffffffffd20._M_head_impl,in_stack_fffffffffffffd18);
  Demodulator::getSoftBitsQueue(in_stack_fffffffffffffbe8);
  Decoder::Decoder(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  std::shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>_>::~shared_ptr
            ((shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>_> *)0x1782c7
            );
  Decoder::initialize((Decoder *)in_stack_fffffffffffffc00.__r,in_stack_fffffffffffffbf8);
  Monitor::Monitor((Monitor *)in_stack_fffffffffffffbf8,(bool)verbose,in_stack_fffffffffffffc00);
  Monitor::initialize((Monitor *)in_stack_fffffffffffffd10._M_head_impl,in_stack_fffffffffffffd08);
  local_3e0 = signalHandler;
  sigemptyset((sigset_t *)&stack0xfffffffffffffc28);
  __oact = (sigaction *)0x0;
  this = (Config *)&local_3e0;
  sigaction(2,(sigaction *)this,(sigaction *)0x0);
  sigaction(0xf,(sigaction *)this,__oact);
  Demodulator::start((Demodulator *)in_stack_fffffffffffffc00.__r);
  Decoder::start((Decoder *)in_stack_fffffffffffffc00.__r);
  Monitor::start((Monitor *)
                 CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffc16,in_stack_fffffffffffffc10)));
  while (((sigint ^ 0xffU) & 1) != 0) {
    pause();
  }
  Demodulator::stop((Demodulator *)this);
  Decoder::stop((Decoder *)0x17845c);
  Monitor::stop((Monitor *)this);
  local_4 = 0;
  Monitor::~Monitor((Monitor *)this);
  Decoder::~Decoder((Decoder *)this);
  Demodulator::~Demodulator((Demodulator *)this);
  Config::~Config(this);
  Options::~Options((Options *)0x1784b9);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  auto opts = parseOptions(argc, argv);
  auto config = Config::load(opts.config);

  // Convert string option to enum
  Demodulator::Type downlinkType;
  if (config.demodulator.downlinkType == "lrit") {
    downlinkType = Demodulator::LRIT;
  } else if (config.demodulator.downlinkType == "hrit") {
    downlinkType = Demodulator::HRIT;
  } else {
    std::cerr
      << "Invalid downlink type: "
      << config.demodulator.downlinkType
      << std::endl;
    exit(1);
  }

  Demodulator demod(downlinkType);
  demod.initialize(config);

  Decoder decode(demod.getSoftBitsQueue());
  decode.initialize(config);

  Monitor monitor(opts.verbose, opts.interval);
  monitor.initialize(config);

  // Install signal handler
  struct sigaction sa;
  sa.sa_handler = signalHandler;
  sigemptyset(&sa.sa_mask);
  sa.sa_flags = 0;
  sigaction(SIGINT, &sa, NULL);
  sigaction(SIGTERM, &sa, NULL);

  demod.start();
  decode.start();
  monitor.start();

  while (!sigint) {
    pause();
  }

  demod.stop();
  decode.stop();
  monitor.stop();

  return 0;
}